

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * execute_abi_cxx11_(string *__return_storage_ptr__,char *cmd)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  char *pcVar3;
  allocator local_99;
  char buffer [128];
  
  __stream = popen(cmd,"r");
  if (__stream == (FILE *)0x0) {
    piVar2 = __errno_location();
    error(1,*piVar2,"Pipe error");
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_99);
  while( true ) {
    iVar1 = feof(__stream);
    if (iVar1 != 0) break;
    pcVar3 = fgets(buffer,0x80,__stream);
    if (pcVar3 != (char *)0x0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  pclose(__stream);
  return __return_storage_ptr__;
}

Assistant:

std::string execute(const char* cmd)
{
    FILE* pipe = popen(cmd, "r");
    if (!pipe)
        error(EXIT_FAILURE, errno, "Pipe error");
    char buffer[128];
    std::string result = "";
    while(!feof(pipe))
        if(fgets(buffer, 128, pipe) != NULL)
            result += buffer;
    pclose(pipe);
    return result;
}